

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O0

Verbosity loguru::get_verbosity_from_name(char *name)

{
  int iVar1;
  int local_18;
  Verbosity local_14;
  Verbosity verbosity;
  char *name_local;
  
  if (s_name_to_verbosity_callback == (code *)0x0) {
    local_18 = -10;
  }
  else {
    local_18 = (*s_name_to_verbosity_callback)(name);
  }
  local_14 = local_18;
  if (local_18 == -10) {
    iVar1 = strcmp(name,"OFF");
    if (iVar1 == 0) {
      local_14 = -9;
    }
    else {
      iVar1 = strcmp(name,"INFO");
      if (iVar1 == 0) {
        local_14 = 0;
      }
      else {
        iVar1 = strcmp(name,"WARNING");
        if (iVar1 == 0) {
          local_14 = -1;
        }
        else {
          iVar1 = strcmp(name,"ERROR");
          if (iVar1 == 0) {
            local_14 = -2;
          }
          else {
            iVar1 = strcmp(name,"FATAL");
            if (iVar1 == 0) {
              local_14 = -3;
            }
          }
        }
      }
    }
  }
  return local_14;
}

Assistant:

Verbosity get_verbosity_from_name(const char* name)
	{
		auto verbosity = s_name_to_verbosity_callback
				? (*s_name_to_verbosity_callback)(name)
				: Verbosity_INVALID;

		// Use standard replacements if callback fails:
		if (verbosity == Verbosity_INVALID) {
			if (strcmp(name, "OFF") == 0) {
				verbosity = Verbosity_OFF;
			} else if (strcmp(name, "INFO") == 0) {
				verbosity = Verbosity_INFO;
			} else if (strcmp(name, "WARNING") == 0) {
				verbosity = Verbosity_WARNING;
			} else if (strcmp(name, "ERROR") == 0) {
				verbosity = Verbosity_ERROR;
			} else if (strcmp(name, "FATAL") == 0) {
				verbosity = Verbosity_FATAL;
			}
		}

		return verbosity;
	}